

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

RefAs * __thiscall wasm::Builder::makeRefAs(Builder *this,RefAsOp op,Expression *value)

{
  RefAs *this_00;
  
  this_00 = (RefAs *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression._id = RefAsId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)72>).super_Expression.type.id = 0;
  this_00->op = op;
  this_00->value = value;
  RefAs::finalize(this_00);
  return this_00;
}

Assistant:

RefAs* makeRefAs(RefAsOp op, Expression* value) {
    auto* ret = wasm.allocator.alloc<RefAs>();
    ret->op = op;
    ret->value = value;
    ret->finalize();
    return ret;
  }